

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mycanvas.c
# Opt level: O3

void my_canvas_dialog(t_my_canvas *x,t_symbol *s,int argc,t_atom *argv)

{
  t_iem_init_symargs *ptVar1;
  _glist *canvas;
  t_symbol *s_00;
  int iVar2;
  t_float tVar3;
  t_float tVar4;
  t_float tVar5;
  uint uVar6;
  uint uVar7;
  t_symbol *srl [3];
  t_atom undo [18];
  t_symbol *local_178 [4];
  t_atom local_158;
  undefined4 local_148;
  undefined4 local_140;
  undefined4 local_138;
  float local_130;
  undefined4 local_128;
  float local_120;
  undefined4 local_108;
  undefined4 local_100;
  undefined4 local_68;
  t_symbol *local_60;
  
  tVar3 = atom_getfloatarg(0,argc,argv);
  tVar4 = atom_getfloatarg(2,argc,argv);
  tVar5 = atom_getfloatarg(3,argc,argv);
  iemgui_setdialogatoms(&x->x_gui,0x12,&local_158);
  local_148 = 1;
  local_140 = 0;
  local_138 = 1;
  local_130 = (float)x->x_vis_w;
  local_128 = 1;
  local_120 = (float)x->x_vis_h;
  local_108 = 1;
  local_100 = 0xbf800000;
  local_68 = 2;
  local_60 = gensym("none");
  canvas = (x->x_gui).x_glist;
  s_00 = gensym("dialog");
  pd_undo_set_objectstate(canvas,(t_pd *)x,s_00,0x12,&local_158,argc,argv);
  iemgui_dialog(&x->x_gui,local_178,argc,argv);
  ptVar1 = &(x->x_gui).x_isa;
  *(byte *)ptVar1 = *(byte *)ptVar1 & 0xfe;
  iVar2 = 1;
  if (1 < (int)tVar3) {
    iVar2 = (int)tVar3;
  }
  iVar2 = iVar2 * ((x->x_gui).x_glist)->gl_zoom;
  (x->x_gui).x_w = iVar2;
  (x->x_gui).x_h = iVar2;
  uVar6 = -(uint)(1 < (int)tVar4);
  uVar7 = -(uint)(1 < (int)tVar5);
  x->x_vis_w = ~uVar6 & 1 | (int)tVar4 & uVar6;
  x->x_vis_h = ~uVar7 & 1 | (int)tVar5 & uVar7;
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void my_canvas_dialog(t_my_canvas *x, t_symbol *s, int argc, t_atom *argv)
{
    t_symbol *srl[3];
    int a = atom_getfloatarg(0, argc, argv);
    int w = atom_getfloatarg(2, argc, argv);
    int h = atom_getfloatarg(3, argc, argv);
    int sr_flags;
    t_atom undo[18];
    iemgui_setdialogatoms(&x->x_gui, 18, undo);
    SETFLOAT (undo+1, 0);
    SETFLOAT (undo+2, x->x_vis_w);
    SETFLOAT (undo+3, x->x_vis_h);
    SETFLOAT (undo+5, -1);
    SETSYMBOL(undo+15, gensym("none"));

    pd_undo_set_objectstate(x->x_gui.x_glist, (t_pd*)x, gensym("dialog"),
                            18, undo,
                            argc, argv);

    sr_flags = iemgui_dialog(&x->x_gui, srl, argc, argv);
    x->x_gui.x_isa.x_loadinit = 0;
    if(a < 1)
        a = 1;
    x->x_gui.x_w = a * IEMGUI_ZOOM(x);
    x->x_gui.x_h = x->x_gui.x_w;
    if(w < 1)
        w = 1;
    x->x_vis_w = w;
    if(h < 1)
        h = 1;
    x->x_vis_h = h;
    iemgui_size((void *)x, &x->x_gui);
}